

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cc
# Opt level: O2

char * Varint::Skip64BackwardSlow(char *p,char *b)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  
  if (p < b) {
    __assert_fail("ptr >= base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/varint.cc"
                  ,0x107,"static const char *Varint::Skip64BackwardSlow(const char *, const char *)"
                 );
  }
  if ((p == b) || (uVar2 = 0, p[-1] < '\0')) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar1 = p + -1;
    do {
      pcVar3 = pcVar1;
      if ((pcVar3 == b) || (9 < uVar2)) {
        if (uVar2 < 10) {
          return pcVar3;
        }
        return (char *)0x0;
      }
      uVar2 = uVar2 + 1;
      pcVar1 = pcVar3 + -1;
    } while (pcVar3[-1] < '\0');
  }
  return pcVar3;
}

Assistant:

const char* Varint::Skip64BackwardSlow(const char* p, const char* b) {
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  const unsigned char* base = reinterpret_cast<const unsigned char*>(b);
  assert(ptr >= base);

  // If the initial pointer is at the base or if the previous byte is not
  // the last byte of a varint, we return nullptr since there is nothing to
  // skip.
  if (ptr == base) return nullptr;
  if (*(--ptr) > 127) return nullptr;

  for (int i = 0; i < 10; i++) {
    if (ptr == base)    return reinterpret_cast<const char*>(ptr);
    if (*(--ptr) < 128) return reinterpret_cast<const char*>(ptr + 1);
  }

  return nullptr; // value is too long to be a varint64
}